

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLScanner::scanReset(XMLScanner *this,XMLPScanToken *token)

{
  RuntimeException *this_00;
  
  if ((this->fScannerId == *(XMLUInt32 *)token) && (this->fSequenceId == *(XMLUInt32 *)(token + 4)))
  {
    ReaderMgr::reset(&this->fReaderMgr);
    this->fSequenceId = this->fSequenceId + 1;
    this->fErrorCount = 0;
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
             ,0x27f,Scan_BadPScanToken,this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLScanner::scanReset(XMLPScanToken& token)
{
    // Make sure this token is still legal
    if (!isLegalToken(token))
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_BadPScanToken, fMemoryManager);

    // Reset the reader manager
    fReaderMgr.reset();

    // And invalidate any tokens by bumping our sequence number
    fSequenceId++;

    // Reset our error count
    fErrorCount = 0;
}